

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

vector<vera::Image,_std::allocator<vera::Image>_> *
vera::scaleSprite(vector<vera::Image,_std::allocator<vera::Image>_> *__return_storage_ptr__,
                 vector<vera::Image,_std::allocator<vera::Image>_> *_in,int _times)

{
  pointer pIVar1;
  pointer ptVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  _func_int *p_Var6;
  ulong uVar7;
  size_type __new_size;
  ulong uVar8;
  long lVar9;
  thread *t_1;
  pointer ptVar10;
  vector<vera::Image,_std::allocator<vera::Image>_> in_scaled;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Image last_layer;
  thread t;
  vector<vera::Image,_std::allocator<vera::Image>_> local_168;
  vector<std::thread,_std::allocator<std::thread>_> local_148;
  pointer local_128;
  pointer local_120;
  long local_118;
  undefined1 local_110 [40];
  string local_e8 [32];
  vector<float,_std::allocator<float>_> local_c8;
  undefined8 local_b0;
  int local_a8;
  Image local_a0;
  
  local_120 = (_in->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_128 = (_in->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  __new_size = ((long)local_128 - (long)local_120 >> 4) * 0x6db6db6db6db6db7;
  local_168.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vera::Image,_std::allocator<vera::Image>_>::resize(&local_168,__new_size);
  local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = std::thread::hardware_concurrency();
  uVar5 = ((long)(_in->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(_in->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  uVar8 = (ulong)iVar3;
  uVar4 = uVar5 / uVar8;
  lVar9 = 0;
  local_118 = (long)(iVar3 + -1);
  while( true ) {
    local_a0._vptr_Image = (_func_int **)0x0;
    local_110._0_8_ = operator_new(0x30);
    p_Var6 = (_func_int *)(lVar9 * uVar4);
    uVar7 = 0;
    if (local_118 == lVar9) {
      uVar7 = uVar5 % uVar8;
    }
    *(undefined ***)local_110._0_8_ = &PTR___State_003ec520;
    *(vector<vera::Image,_std::allocator<vera::Image>_> **)(local_110._0_8_ + 8) = &local_168;
    *(vector<vera::Image,_std::allocator<vera::Image>_> **)(local_110._0_8_ + 0x10) = _in;
    *(_func_int **)(local_110._0_8_ + 0x18) = p_Var6;
    *(_func_int **)(local_110._0_8_ + 0x20) = p_Var6 + uVar7 + uVar4;
    *(_func_int **)(local_110._0_8_ + 0x28) = (_func_int *)((long)_times * __new_size);
    std::thread::_M_start_thread(&local_a0,local_110,0);
    if ((_func_int **)local_110._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_110._0_8_ + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&local_148,(thread *)&local_a0);
    ptVar2 = local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_a0._vptr_Image != (_func_int **)0x0) break;
    lVar9 = lVar9 + 1;
    if (uVar8 + (uVar8 == 0) == lVar9) {
      local_a0._vptr_Image = (_func_int **)0x0;
      for (ptVar10 = local_148.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_start; ptVar10 != ptVar2; ptVar10 = ptVar10 + 1) {
        std::thread::join();
      }
      (__return_storage_ptr__->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Image::Image((Image *)local_110);
      if (local_128 != local_120) {
        lVar9 = 0;
        do {
          if (lVar9 != 0 && 1 < _times) {
            iVar3 = 1;
            do {
              fade(&local_a0,(Image *)local_110,
                   local_168.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar9,(float)iVar3 / (float)_times);
              std::vector<vera::Image,_std::allocator<vera::Image>_>::emplace_back<vera::Image>
                        (__return_storage_ptr__,&local_a0);
              Image::~Image(&local_a0);
              iVar3 = iVar3 + 1;
            } while (_times != iVar3);
          }
          std::vector<vera::Image,_std::allocator<vera::Image>_>::push_back
                    (__return_storage_ptr__,
                     local_168.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl
                     .super__Vector_impl_data._M_start + lVar9);
          pIVar1 = local_168.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (__new_size - 1 == lVar9) {
            iVar3 = _times + -1;
            if (1 < _times) {
              do {
                std::vector<vera::Image,_std::allocator<vera::Image>_>::push_back
                          (__return_storage_ptr__,
                           local_168.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar9);
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)(local_110 + 8));
            std::__cxx11::string::_M_assign(local_e8);
            std::vector<float,_std::allocator<float>_>::operator=(&local_c8,&pIVar1[lVar9].m_data);
            local_a8 = pIVar1[lVar9].m_channels;
            local_b0._0_4_ = pIVar1[lVar9].m_width;
            local_b0._4_4_ = pIVar1[lVar9].m_height;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != __new_size + (__new_size == 0));
      }
      Image::~Image((Image *)local_110);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_148);
      std::vector<vera::Image,_std::allocator<vera::Image>_>::~vector(&local_168);
      return __return_storage_ptr__;
    }
  }
  std::terminate();
}

Assistant:

std::vector<Image>  scaleSprite(const std::vector<Image>& _in, int _times) {
    size_t in_voxel_resolution = _in.size();
    size_t out_voxel_resolution = in_voxel_resolution * _times;
    std::vector<Image> in_scaled;
    in_scaled.resize(_in.size());

    std::vector<std::thread> threads;
    const int nThreads = std::thread::hardware_concurrency();
    size_t layersPerThread = _in.size() / nThreads;
    size_t layersLeftOver = _in.size() % nThreads;
    for (size_t i = 0; i < nThreads; ++i) {
        size_t start_layer = i * layersPerThread;
        size_t end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t( [&in_scaled, &_in, start_layer, end_layer, out_voxel_resolution]() {
            for (size_t z = start_layer; z < end_layer; z++) {
                in_scaled[z] = vera::scale(_in[z], out_voxel_resolution, out_voxel_resolution);
            }
        });

        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    std::vector<Image> out;
    vera::Image last_layer;
    for (int z = 0; z < in_voxel_resolution; z++) {
        if (z == 0)
            out.push_back( in_scaled[z] );
        else {
            for (int i = 1; i < _times; i++)
                out.push_back( vera::fade(last_layer, in_scaled[z], float(i) / float(_times)) );
            out.push_back( in_scaled[z] );
        }

        if ( z == in_voxel_resolution - 1) {
            for (int i = 1; i < _times; i++)
                out.push_back( in_scaled[z] );
        }
        else 
            last_layer = in_scaled[z];
    }

    return out;
}